

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnView::setModel(QColumnView *this,QAbstractItemModel *model)

{
  QColumnViewPrivate *this_00;
  long in_FS_OFFSET;
  QModelIndex local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QColumnViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if ((this_00->super_QAbstractItemViewPrivate).model != model) {
    local_30.r = -1;
    local_30.c = -1;
    local_30.i = 0;
    local_30.m.ptr = (QAbstractItemModel *)0x0;
    QColumnViewPrivate::closeColumns(this_00,&local_30,false);
    QAbstractItemView::setModel((QAbstractItemView *)this,model);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::setModel(QAbstractItemModel *model)
{
    Q_D(QColumnView);
    if (model == d->model)
        return;
    d->closeColumns();
    QAbstractItemView::setModel(model);
}